

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O0

Int64ToDoubleMap * __thiscall
CoreML::Specification::Imputer::mutable_imputedint64dictionary(Imputer *this)

{
  bool bVar1;
  Int64ToDoubleMap *this_00;
  Imputer *this_local;
  
  bVar1 = has_imputedint64dictionary(this);
  if (!bVar1) {
    clear_ImputedValue(this);
    set_has_imputedint64dictionary(this);
    this_00 = (Int64ToDoubleMap *)operator_new(0x38);
    Int64ToDoubleMap::Int64ToDoubleMap(this_00);
    (this->ImputedValue_).imputedint64dictionary_ = this_00;
  }
  return (Int64ToDoubleMap *)(this->ImputedValue_).imputeddoublevalue_;
}

Assistant:

inline ::CoreML::Specification::Int64ToDoubleMap* Imputer::mutable_imputedint64dictionary() {
  if (!has_imputedint64dictionary()) {
    clear_ImputedValue();
    set_has_imputedint64dictionary();
    ImputedValue_.imputedint64dictionary_ = new ::CoreML::Specification::Int64ToDoubleMap;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Imputer.imputedInt64Dictionary)
  return ImputedValue_.imputedint64dictionary_;
}